

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.cpp
# Opt level: O0

void __thiscall
Diligent::DynamicDescriptorSetAllocator::~DynamicDescriptorSetAllocator
          (DynamicDescriptorSetAllocator *this)

{
  undefined *puVar1;
  bool bVar2;
  Char *Message;
  undefined8 uVar3;
  unsigned_long *in_R8;
  undefined1 local_50 [8];
  string _msg;
  string msg;
  DynamicDescriptorSetAllocator *this_local;
  
  bVar2 = std::
          vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
          ::empty(&this->m_AllocatedPools);
  if (!bVar2) {
    FormatString<char[75]>
              ((string *)((long)&_msg.field_2 + 8),
               (char (*) [75])
               "All allocated pools must be returned to the parent descriptor pool manager");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"~DynamicDescriptorSetAllocator",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DescriptorPoolManager.cpp"
               ,0x140);
    std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
  }
  FormatString<std::__cxx11::string,char[30],unsigned_long>
            ((string *)local_50,(Diligent *)&this->m_Name,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             " peak descriptor pool count: ",(char (*) [30])&this->m_PeakPoolCount,in_R8);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar3 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(0,uVar3,0);
  }
  std::__cxx11::string::~string((string *)local_50);
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkDescriptorPool_T_*,_(VulkanUtilities::VulkanHandleTypeId)14>_>_>
  ::~vector(&this->m_AllocatedPools);
  std::__cxx11::string::~string((string *)&this->m_Name);
  return;
}

Assistant:

DynamicDescriptorSetAllocator::~DynamicDescriptorSetAllocator()
{
    DEV_CHECK_ERR(m_AllocatedPools.empty(), "All allocated pools must be returned to the parent descriptor pool manager");
    LOG_INFO_MESSAGE(m_Name, " peak descriptor pool count: ", m_PeakPoolCount);
}